

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlib.c
# Opt level: O0

void xpose(float *indata,long iRsiz,float *outdata,long oRsiz,long Nrows,long Ncols)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  float *ocol;
  float *irow;
  long inRsizd8;
  long inRsizd7;
  long inRsizd6;
  long inRsizd5;
  long inRsizd4;
  long inRsizd3;
  long inRsizd2;
  long inRsizd1;
  float T7;
  float T6;
  float T5;
  float T4;
  float T3;
  float T2;
  float T1;
  float T0;
  long ColCnt;
  long RowCnt;
  float *odata;
  float *idata;
  
  _T7 = in_RDX;
  _T5 = in_RDI;
  for (inRsizd3 = in_R8 / 8; inRsizd4 = in_R9, 0 < inRsizd3; inRsizd3 = inRsizd3 + -1) {
    inRsizd1 = _T5;
    inRsizd2 = _T7;
    for (; 0 < inRsizd4; inRsizd4 = inRsizd4 + -1) {
      uVar1 = *(undefined4 *)(inRsizd1 + in_RSI * 4);
      uVar2 = *(undefined4 *)(inRsizd1 + in_RSI * 8);
      uVar3 = *(undefined4 *)(inRsizd1 + in_RSI * 0xc);
      uVar4 = *(undefined4 *)(inRsizd1 + in_RSI * 0x10);
      uVar5 = *(undefined4 *)(inRsizd1 + in_RSI * 0x14);
      uVar6 = *(undefined4 *)(inRsizd1 + in_RSI * 0x18);
      uVar7 = *(undefined4 *)(inRsizd1 + in_RSI * 0x1c);
      *(undefined4 *)inRsizd2 = *(undefined4 *)inRsizd1;
      *(undefined4 *)(inRsizd2 + 4) = uVar1;
      *(undefined4 *)(inRsizd2 + 8) = uVar2;
      *(undefined4 *)(inRsizd2 + 0xc) = uVar3;
      *(undefined4 *)(inRsizd2 + 0x10) = uVar4;
      *(undefined4 *)(inRsizd2 + 0x14) = uVar5;
      *(undefined4 *)(inRsizd2 + 0x18) = uVar6;
      *(undefined4 *)(inRsizd2 + 0x1c) = uVar7;
      inRsizd1 = inRsizd1 + 4;
      inRsizd2 = in_RCX * 4 + inRsizd2;
    }
    _T5 = in_RSI * 0x20 + _T5;
    _T7 = _T7 + 0x20;
  }
  if (in_R8 % 8 != 0) {
    for (; 0 < inRsizd4; inRsizd4 = inRsizd4 + -1) {
      inRsizd1 = _T5;
      inRsizd2 = _T7;
      _T7 = in_RCX * 4 + _T7;
      for (inRsizd3 = in_R8 % 8; 0 < inRsizd3; inRsizd3 = inRsizd3 + -1) {
        *(undefined4 *)inRsizd2 = *(undefined4 *)inRsizd1;
        inRsizd1 = in_RSI * 4 + inRsizd1;
        inRsizd2 = inRsizd2 + 4;
      }
      _T5 = _T5 + 4;
    }
  }
  return;
}

Assistant:

void xpose(float *indata, long iRsiz, float *outdata, long oRsiz, long Nrows, long Ncols){
/* not in-place matrix transpose	*/
/* INPUTS */
/* *indata = input data array	*/
/* iRsiz = offset to between rows of input data array	*/
/* oRsiz = offset to between rows of output data array	*/
/* Nrows = number of rows in input data array	*/
/* Ncols = number of columns in input data array	*/
/* OUTPUTS */
/* *outdata = output data array	*/

float	*irow; 		/* pointer to input row start */
float	*ocol; 		/* pointer to output col start */
float	*idata; 	/* pointer to input data */
float	*odata; 	/* pointer to output data */
long 	RowCnt;		/* row counter */
long 	ColCnt;		/* col counter */
float	T0; 		/* data storage */
float	T1; 		/* data storage */
float	T2; 		/* data storage */
float	T3; 		/* data storage */
float	T4; 		/* data storage */
float	T5; 		/* data storage */
float	T6; 		/* data storage */
float	T7; 		/* data storage */
const long inRsizd1 = iRsiz;
const long inRsizd2 = 2*iRsiz;
const long inRsizd3 = inRsizd2+iRsiz;
const long inRsizd4 = 4*iRsiz;
const long inRsizd5 = inRsizd3+inRsizd2;
const long inRsizd6 = inRsizd4+inRsizd2;
const long inRsizd7 = inRsizd4+inRsizd3;
const long inRsizd8 = 8*iRsiz;

ocol = outdata;
irow = indata;
for (RowCnt=Nrows/8; RowCnt>0; RowCnt--){
	idata = irow;
	odata = ocol;
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		T0 = *idata;
		T1 = *(idata+inRsizd1);
		T2 = *(idata+inRsizd2);
		T3 = *(idata+inRsizd3);
		T4 = *(idata+inRsizd4);
		T5 = *(idata+inRsizd5);
		T6 = *(idata+inRsizd6);
		T7 = *(idata+inRsizd7);
		*odata = T0;
		*(odata+1) = T1;
		*(odata+2) = T2;
		*(odata+3) = T3;
		*(odata+4) = T4;
		*(odata+5) = T5;
		*(odata+6) = T6;
		*(odata+7) = T7;
		idata++;
		odata += oRsiz;
	}
	irow += inRsizd8;
	ocol += 8;
}
if (Nrows%8 != 0){
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		idata = irow++;
		odata = ocol;
		ocol += oRsiz;
		for (RowCnt=Nrows%8; RowCnt>0; RowCnt--){
			T0 = *idata;
			*odata++ = T0;
			idata += iRsiz;
		}
	}
}
}